

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O1

void __thiscall
TPZSYsmpMatrix<long_double>::AddKel
          (TPZSYsmpMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  long lVar5;
  ostream *poVar6;
  longdouble *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble lVar13;
  longdouble lVar14;
  longdouble in_ST2;
  longdouble lVar15;
  longdouble in_ST3;
  longdouble lVar16;
  longdouble in_ST4;
  longdouble in_ST5;
  
  if (0 < (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      if (0 < (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) {
        lVar10 = 0;
        lVar13 = in_ST0;
        lVar12 = in_ST1;
        lVar14 = in_ST2;
        lVar15 = in_ST3;
        lVar16 = in_ST4;
        do {
          lVar1 = destinationindex->fStore[lVar11];
          lVar2 = destinationindex->fStore[lVar10];
          in_ST0 = lVar13;
          in_ST1 = lVar12;
          in_ST2 = lVar14;
          in_ST3 = lVar15;
          in_ST4 = lVar16;
          if ((lVar1 <= lVar2) &&
             ((*(elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(elmat,lVar11,lVar10), in_ST0 = lVar12, in_ST1 = lVar14,
             in_ST2 = lVar15, in_ST3 = lVar16, in_ST4 = in_ST5, (longdouble)1e-16 <= ABS(lVar13))) {
            lVar8 = lVar9 + 1;
            plVar3 = (this->fIA).fStore;
            lVar5 = plVar3[lVar1];
            if ((lVar8 < lVar5) ||
               ((plVar3[lVar1 + 1] <= lVar8 || ((this->fJA).fStore[lVar9 + 1] != lVar2)))) {
              lVar1 = plVar3[lVar1 + 1];
              lVar9 = lVar5;
              bVar4 = true;
              if (lVar5 < lVar1) {
                plVar3 = (this->fJA).fStore;
                lVar8 = lVar5 * 8;
                do {
                  lVar9 = *(long *)((long)plVar3 + lVar8);
                  if ((lVar9 == lVar2) || (lVar9 == -1)) {
                    if (lVar9 == -1) {
                      *(long *)((long)plVar3 + lVar8) = lVar2;
                      plVar7 = (this->fA).fStore;
                    }
                    else {
                      plVar7 = (this->fA).fStore;
                      lVar13 = *(longdouble *)((long)plVar7 + lVar8 * 2) + lVar13;
                    }
                    *(longdouble *)((long)plVar7 + lVar8 * 2) = lVar13;
                    lVar9 = lVar5;
                    bVar4 = false;
                    break;
                  }
                  lVar5 = lVar5 + 1;
                  lVar8 = lVar8 + 8;
                  lVar9 = lVar1;
                  bVar4 = true;
                } while (lVar1 != lVar5);
              }
            }
            else {
              plVar7 = (this->fA).fStore;
              plVar7[lVar8] = plVar7[lVar8] + lVar13;
              lVar9 = lVar8;
              bVar4 = false;
            }
            if (bVar4) {
              lVar13 = in_ST5;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "TPZSYsmpMatrix::AddKel: Non existing position on sparse matrix: line =",
                         0x46);
              poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," column =",9);
              poVar6 = std::ostream::_M_insert<long>((long)poVar6);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              in_ST0 = lVar12;
              in_ST1 = lVar14;
              in_ST2 = lVar15;
              in_ST3 = lVar16;
              in_ST4 = in_ST5;
              in_ST5 = lVar13;
            }
          }
          lVar10 = lVar10 + 1;
          lVar13 = in_ST0;
          lVar12 = in_ST1;
          lVar14 = in_ST2;
          lVar15 = in_ST3;
          lVar16 = in_ST4;
        } while (lVar10 < (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow);
  }
  return;
}

Assistant:

void TPZSYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & destinationindex){
    int64_t i,j,k = 0;
    TVar value=0.;
    int64_t ipos,jpos;
    for(i=0;i<elmat.Rows();i++){
        for(j=0;j<elmat.Rows();j++){
            ipos=destinationindex[i];
            jpos=destinationindex[j];
            if(jpos<ipos) continue;
            value=elmat.GetVal(i,j);
            //cout << "j= " << j << endl;
            if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
                int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
                if(!flag) std::cout << "TPZSYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << std::endl;         }
        }
    }
}